

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void soplex::
     MPSreadRows<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (MPSInput *mps,
               LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *rset,NameSet *rnames,SPxOut *spxout)

{
  bool bVar1;
  Verbosity VVar2;
  int iVar3;
  char *pcVar4;
  ulong *puVar5;
  SPxOut *in_RCX;
  MPSInput *in_RDX;
  MPSInput *in_RDI;
  Verbosity old_verbosity;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  row;
  undefined4 in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc8c;
  MPSInput *in_stack_fffffffffffffc90;
  undefined8 in_stack_fffffffffffffc98;
  MPSInput *row_00;
  undefined7 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca7;
  undefined8 local_338;
  undefined1 local_330 [56];
  ulong local_2f8;
  undefined1 local_2f0 [24];
  MPSInput *in_stack_fffffffffffffd28;
  undefined8 local_2b8;
  undefined1 local_2b0 [56];
  undefined8 local_278;
  undefined1 local_270 [56];
  undefined1 local_238 [56];
  undefined8 local_200;
  undefined1 local_1f8 [56];
  undefined4 local_1c0;
  undefined4 local_1bc;
  Verbosity local_1b8 [54];
  SPxOut *local_e0;
  MPSInput *local_d8;
  MPSInput *local_c8;
  undefined8 local_c0;
  undefined8 *local_b8;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined8 *local_88;
  undefined1 *local_80;
  undefined8 local_78;
  undefined8 *local_70;
  undefined1 *local_68;
  undefined8 local_60;
  ulong *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined8 *local_40;
  undefined1 *local_38;
  undefined8 *local_30;
  ulong *local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  undefined8 local_10;
  undefined8 *local_8;
  
  local_e0 = in_RCX;
  local_d8 = in_RDX;
  local_c8 = in_RDI;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::LPRowBase((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
              (int)((ulong)in_stack_fffffffffffffc98 >> 0x20));
  do {
    bVar1 = MPSInput::readLine(in_stack_fffffffffffffd28);
    if (!bVar1) {
LAB_001b65a0:
      MPSInput::syntaxError(in_stack_fffffffffffffc90);
      local_1c0 = 0;
LAB_001b65ba:
      LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::~LPRowBase((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x1b65c7);
      return;
    }
    pcVar4 = MPSInput::field0(local_c8);
    if (pcVar4 != (char *)0x0) {
      if ((local_e0 != (SPxOut *)0x0) && (VVar2 = SPxOut::getVerbosity(local_e0), 3 < (int)VVar2)) {
        local_1b8[0] = SPxOut::getVerbosity(local_e0);
        local_1bc = 4;
        (*local_e0->_vptr_SPxOut[2])(local_e0,&local_1bc);
        operator<<((SPxOut *)in_stack_fffffffffffffc90,
                   (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        MPSInput::objName(local_c8);
        operator<<((SPxOut *)in_stack_fffffffffffffc90,
                   (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        operator<<((SPxOut *)in_stack_fffffffffffffc90,
                   (_func_ostream_ptr_ostream_ptr *)
                   CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        (*local_e0->_vptr_SPxOut[2])(local_e0,local_1b8);
      }
      pcVar4 = MPSInput::field0(local_c8);
      iVar3 = strcmp(pcVar4,"COLUMNS");
      if (iVar3 == 0) {
        MPSInput::setSection(local_c8,COLUMNS);
        local_1c0 = 1;
        goto LAB_001b65ba;
      }
      goto LAB_001b65a0;
    }
    pcVar4 = MPSInput::field1(local_c8);
    if ((pcVar4 == (char *)0x0) || (pcVar4 = MPSInput::field2(local_c8), pcVar4 == (char *)0x0))
    goto LAB_001b65a0;
    pcVar4 = MPSInput::field1(local_c8);
    if (*pcVar4 == 'N') {
      pcVar4 = MPSInput::objName(local_c8);
      if (*pcVar4 == '\0') {
        MPSInput::field2(local_c8);
        MPSInput::setObjName
                  (in_stack_fffffffffffffc90,
                   (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      }
    }
    else {
      row_00 = local_d8;
      MPSInput::field2(local_c8);
      in_stack_fffffffffffffca7 =
           NameSet::has((NameSet *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                        (char *)row_00);
      if ((bool)in_stack_fffffffffffffca7) goto LAB_001b65a0;
      in_stack_fffffffffffffc90 = local_d8;
      MPSInput::field2(local_c8);
      NameSet::add((NameSet *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                   (char *)row_00);
      pcVar4 = MPSInput::field1(local_c8);
      in_stack_fffffffffffffc8c = (int)*pcVar4;
      if (in_stack_fffffffffffffc8c == 0x45) {
        local_278 = 0;
        local_80 = local_270;
        local_88 = &local_278;
        local_90 = 0;
        local_18 = local_88;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),(double)row_00,
                   in_stack_fffffffffffffc90);
        LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setLhs((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffffc90,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        local_2b8 = 0;
        local_68 = local_2b0;
        local_70 = &local_2b8;
        local_78 = 0;
        local_20 = local_70;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),(double)row_00,
                   in_stack_fffffffffffffc90);
        LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setRhs((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffffc90,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      }
      else if (in_stack_fffffffffffffc8c == 0x47) {
        local_200 = 0;
        local_b0 = local_1f8;
        local_b8 = &local_200;
        local_c0 = 0;
        local_8 = local_b8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),(double)row_00,
                   in_stack_fffffffffffffc90);
        LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setLhs((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffffc90,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        local_a0 = infinity();
        local_98 = local_238;
        local_a8 = 0;
        local_10 = local_a0;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),(double)row_00,
                   in_stack_fffffffffffffc90);
        LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setRhs((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffffc90,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      }
      else {
        if (in_stack_fffffffffffffc8c != 0x4c) {
          MPSInput::syntaxError(in_stack_fffffffffffffc90);
          local_1c0 = 1;
          goto LAB_001b65ba;
        }
        puVar5 = (ulong *)infinity();
        local_2f8 = *puVar5 ^ 0x8000000000000000;
        local_50 = local_2f0;
        local_58 = &local_2f8;
        local_60 = 0;
        local_28 = local_58;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),(double)row_00,
                   in_stack_fffffffffffffc90);
        LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setLhs((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffffc90,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        local_338 = 0;
        local_38 = local_330;
        local_40 = &local_338;
        local_48 = 0;
        local_30 = local_40;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),(double)row_00,
                   in_stack_fffffffffffffc90);
        LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setRhs((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffffc90,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      }
      LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
            (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)row_00);
    }
  } while( true );
}

Assistant:

static void MPSreadRows(MPSInput& mps, LPRowSetBase<R>& rset, NameSet& rnames, SPxOut* spxout)
{
   LPRowBase<R> row;

   while(mps.readLine())
   {
      if(mps.field0() != nullptr)
      {
         SPX_MSG_INFO2((*spxout), (*spxout) << "IMPSRD02 Objective name : " << mps.objName() << std::endl;)

         if(strcmp(mps.field0(), "COLUMNS"))
            break;

         mps.setSection(MPSInput::COLUMNS);

         return;
      }

      if((mps.field1() == nullptr) || (mps.field2() == nullptr))
         break;

      if(*mps.field1() == 'N')
      {
         if(*mps.objName() == '\0')
            mps.setObjName(mps.field2());
      }
      else
      {
         if(rnames.has(mps.field2()))
            break;

         rnames.add(mps.field2());

         switch(*mps.field1())
         {
         case 'G':
            row.setLhs(0.0);
            row.setRhs(R(infinity));
            break;

         case 'E':
            row.setLhs(0.0);
            row.setRhs(0.0);
            break;

         case 'L':
            row.setLhs(R(-infinity));
            row.setRhs(0.0);
            break;

         default:
            mps.syntaxError();
            return;
         }

         rset.add(row);
      }

      assert((*mps.field1() == 'N') || (rnames.number(mps.field2()) == rset.num() - 1));
   }

   mps.syntaxError();
}